

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_sharing.cpp
# Opt level: O2

void benchmarkSharing<FarApart>(void)

{
  char local_b0 [8];
  FarApart t;
  thread local_20;
  thread t1;
  thread t2;
  
  local_b0[0] = '\x01';
  local_b0[1] = '\0';
  local_b0[2] = '\0';
  local_b0[3] = '\0';
  t.c._120_4_ = local_b0._0_4_;
  t1._M_id._M_thread = (id)(id)local_b0;
  std::thread::thread<void(&)(FarApart*),FarApart*,void>(&local_20,readA<FarApart>,(FarApart **)&t1)
  ;
  t._128_8_ = local_b0;
  std::thread::thread<void(&)(FarApart*),FarApart*,void>
            (&t1,writeB<FarApart>,(FarApart **)(t.c + 0x7c));
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&t1);
  std::thread::~thread(&local_20);
  return;
}

Assistant:

void benchmarkSharing() {
  T t;
  t.a = 1;
  t.b = 1;
  std::thread t1(readA<T>, &t);
  std::thread t2(writeB<T>, &t);
  t1.join();
  t2.join();
}